

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alhelpers.c
# Opt level: O3

char * FormatName(ALenum format)

{
  if (format < 0x20021) {
    switch(format) {
    case 0x1100:
      return "Mono, U8";
    case 0x1101:
      return "Mono, S16";
    case 0x1102:
      return "Stereo, U8";
    case 0x1103:
      return "Stereo, S16";
    }
    if (format == 0x10010) {
      return "Mono, Float32";
    }
    if (format == 0x10011) {
      return "Stereo, Float32";
    }
  }
  else if (format < 0x20031) {
    if (format == 0x20021) {
      return "B-Format 2D, U8";
    }
    if (format == 0x20022) {
      return "B-Format 2D, S16";
    }
    if (format == 0x20023) {
      return "B-Format 2D, Float32";
    }
  }
  else {
    if (format == 0x20031) {
      return "B-Format 3D, U8";
    }
    if (format == 0x20032) {
      return "B-Format 3D, S16";
    }
    if (format == 0x20033) {
      return "B-Format 3D, Float32";
    }
  }
  return "Unknown Format";
}

Assistant:

const char *FormatName(ALenum format)
{
    switch(format)
    {
    case AL_FORMAT_MONO8: return "Mono, U8";
    case AL_FORMAT_MONO16: return "Mono, S16";
    case AL_FORMAT_MONO_FLOAT32: return "Mono, Float32";
    case AL_FORMAT_STEREO8: return "Stereo, U8";
    case AL_FORMAT_STEREO16: return "Stereo, S16";
    case AL_FORMAT_STEREO_FLOAT32: return "Stereo, Float32";
    case AL_FORMAT_BFORMAT2D_8: return "B-Format 2D, U8";
    case AL_FORMAT_BFORMAT2D_16: return "B-Format 2D, S16";
    case AL_FORMAT_BFORMAT2D_FLOAT32: return "B-Format 2D, Float32";
    case AL_FORMAT_BFORMAT3D_8: return "B-Format 3D, U8";
    case AL_FORMAT_BFORMAT3D_16: return "B-Format 3D, S16";
    case AL_FORMAT_BFORMAT3D_FLOAT32: return "B-Format 3D, Float32";
    }
    return "Unknown Format";
}